

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O0

bool __thiscall cmBinUtilsMacOSMachOLinker::Prepare(cmBinUtilsMacOSMachOLinker *this)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  ostream *poVar4;
  string local_1e8;
  undefined1 local_1c8 [8];
  ostringstream e;
  unique_ptr<cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool>_>
  local_50 [3];
  undefined1 local_38 [8];
  string tool;
  cmBinUtilsMacOSMachOLinker *this_local;
  
  tool.field_2._8_8_ = this;
  psVar2 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesTool_abi_cxx11_
                     ((this->super_cmBinUtilsLinker).Archive);
  std::__cxx11::string::string((string *)local_38,(string *)psVar2);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=((string *)local_38,"otool");
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"otool");
  if (bVar1) {
    std::
    make_unique<cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool,cmRuntimeDependencyArchive*&>
              ((cmRuntimeDependencyArchive **)local_50);
    std::
    unique_ptr<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,std::default_delete<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool>>
    ::operator=((unique_ptr<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,std::default_delete<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool>>
                 *)&this->Tool,local_50);
    std::
    unique_ptr<cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool>_>
    ::~unique_ptr(local_50);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    poVar4 = std::operator<<((ostream *)local_1c8,
                             "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: ");
    std::operator<<(poVar4,(string *)local_38);
    std::__cxx11::ostringstream::str();
    cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  }
  std::__cxx11::string::~string((string *)local_38);
  return bVar1;
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::Prepare()
{
  std::string tool = this->Archive->GetGetRuntimeDependenciesTool();
  if (tool.empty()) {
    tool = "otool";
  }
  if (tool == "otool") {
    this->Tool =
      cm::make_unique<cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool>(
        this->Archive);
  } else {
    std::ostringstream e;
    e << "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: " << tool;
    this->SetError(e.str());
    return false;
  }

  return true;
}